

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O2

uint * fetchRGBA16FToARGB32PM_avx2
                 (uint *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
                 QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  
  auVar6._8_4_ = 0x437f0000;
  auVar6._0_8_ = 0x437f0000437f0000;
  auVar6._12_4_ = 0x437f0000;
  auVar6._16_4_ = 0x437f0000;
  auVar6._20_4_ = 0x437f0000;
  auVar6._24_4_ = 0x437f0000;
  auVar6._28_4_ = 0x437f0000;
  for (lVar4 = 0; lVar4 + 1 < (long)count; lVar4 = lVar4 + 2) {
    auVar8 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src + lVar4 * 8 + (long)index * 8));
    auVar2 = vshufps_avx(auVar8,auVar8,0xff);
    auVar3._4_4_ = auVar2._4_4_ * auVar8._4_4_;
    auVar3._0_4_ = auVar2._0_4_ * auVar8._0_4_;
    auVar3._8_4_ = auVar2._8_4_ * auVar8._8_4_;
    auVar3._12_4_ = auVar2._12_4_ * auVar8._12_4_;
    auVar3._16_4_ = auVar2._16_4_ * auVar8._16_4_;
    auVar3._20_4_ = auVar2._20_4_ * auVar8._20_4_;
    auVar3._24_4_ = auVar2._24_4_ * auVar8._24_4_;
    auVar3._28_4_ = auVar2._28_4_;
    auVar2 = vblendps_avx(auVar3,auVar8,0x88);
    auVar8._0_4_ = (int)(auVar2._0_4_ * 255.0 + 0.5);
    auVar8._4_4_ = (int)(auVar2._4_4_ * 255.0 + 0.5);
    auVar8._8_4_ = (int)(auVar2._8_4_ * 255.0 + 0.5);
    auVar8._12_4_ = (int)(auVar2._12_4_ * 255.0 + 0.5);
    auVar8._16_4_ = (int)(auVar2._16_4_ * 255.0 + 0.5);
    auVar8._20_4_ = (int)(auVar2._20_4_ * 255.0 + 0.5);
    auVar8._24_4_ = (int)(auVar2._24_4_ * 255.0 + 0.5);
    auVar8._28_4_ = (int)(auVar2._28_4_ + 0.5);
    auVar2 = vpackusdw_avx2(auVar8,auVar6);
    auVar2 = vpshuflw_avx2(auVar2,0xc6);
    auVar2 = vpermq_avx2(auVar2,0xe8);
    auVar1 = vpackuswb_avx(auVar2._0_16_,auVar2._0_16_);
    *(long *)(buffer + lVar4) = auVar1._0_8_;
  }
  if ((int)lVar4 < count) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(src + lVar4 * 8 + (long)index * 8);
    auVar5 = vcvtph2ps_f16c(auVar1);
    auVar1 = vshufps_avx(auVar5,auVar5,0xff);
    auVar7._0_4_ = auVar1._0_4_ * auVar5._0_4_;
    auVar7._4_4_ = auVar1._4_4_ * auVar5._4_4_;
    auVar7._8_4_ = auVar1._8_4_ * auVar5._8_4_;
    auVar7._12_4_ = auVar1._12_4_ * auVar5._12_4_;
    auVar1 = vblendps_avx(auVar7,auVar5,8);
    auVar5._0_4_ = (int)(auVar1._0_4_ * 255.0 + 0.5);
    auVar5._4_4_ = (int)(auVar1._4_4_ * 255.0 + 0.5);
    auVar5._8_4_ = (int)(auVar1._8_4_ * 255.0 + 0.5);
    auVar5._12_4_ = (int)(auVar1._12_4_ * 255.0 + 0.5);
    auVar1 = vpackusdw_avx(auVar5,auVar5);
    auVar1 = vpshuflw_avx(auVar1,0xc6);
    auVar1 = vpackuswb_avx(auVar1,auVar1);
    buffer[lVar4] = auVar1._0_4_;
  }
  return buffer;
}

Assistant:

const uint *QT_FASTCALL fetchRGBA16FToARGB32PM_avx2(uint *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    const quint64 *s = reinterpret_cast<const quint64 *>(src) + index;
    const __m256 vf = _mm256_set1_ps(255.0f);
    const __m256 vh = _mm256_set1_ps(0.5f);
    int i = 0;
    for (; i + 1 < count; i += 2) {
        __m256 vsf = _mm256_cvtph_ps(_mm_loadu_si128((const __m128i *)(s + i)));
        __m256 vsa = _mm256_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm256_mul_ps(vsf, vsa);
        vsf = _mm256_blend_ps(vsf, vsa, 0x88);
        vsf = _mm256_mul_ps(vsf, vf);
        vsf = _mm256_add_ps(vsf, vh);
        __m256i vsi = _mm256_cvttps_epi32(vsf);
        vsi = _mm256_packus_epi32(vsi, vsi);
        vsi = _mm256_shufflelo_epi16(vsi, _MM_SHUFFLE(3, 0, 1, 2));
        vsi = _mm256_permute4x64_epi64(vsi, _MM_SHUFFLE(3, 1, 2, 0));
        __m128i vsi128 = _mm256_castsi256_si128(vsi);
        vsi128 = _mm_packus_epi16(vsi128, vsi128);
        _mm_storel_epi64((__m128i *)(buffer + i), vsi128);
    }
    if (i < count) {
        __m128 vsf = _mm_cvtph_ps(_mm_loadl_epi64((const __m128i *)(s + i)));
        __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        vsf = _mm_mul_ps(vsf, vsa);
        vsf = _mm_insert_ps(vsf, vsa, 0x30);
        vsf = _mm_mul_ps(vsf, _mm_set1_ps(255.0f));
        vsf = _mm_add_ps(vsf, _mm_set1_ps(0.5f));
        __m128i vsi = _mm_cvttps_epi32(vsf);
        vsi = _mm_packus_epi32(vsi, vsi);
        vsi = _mm_shufflelo_epi16(vsi, _MM_SHUFFLE(3, 0, 1, 2));
        vsi = _mm_packus_epi16(vsi, vsi);
        buffer[i] = _mm_cvtsi128_si32(vsi);
    }
    return buffer;
}